

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  long lVar5;
  char *value;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  FileOptions *pFVar6;
  FileOptions *pFVar7;
  long lVar8;
  long lVar9;
  
  psVar3 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar4 = (proto->name_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,psVar3);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  psVar3 = *(string **)(this + 8);
  if (psVar3->_M_string_length != 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    psVar4 = (proto->package_).ptr_;
    if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&proto->package_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  if (*(int *)(this + 0x8c) == 3) {
    value = SyntaxName(SYNTAX_PROTO3);
    FileDescriptorProto::set_syntax(proto,value);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar8 = 0;
    do {
      if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                  (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
      }
      FileDescriptorProto::add_dependency
                (proto,(string *)**(undefined8 **)(*(long *)(this + 0x20) + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(this + 0x18));
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar8 = 0;
    do {
      iVar1 = *(int *)(*(long *)(this + 0x40) + lVar8 * 4);
      iVar2 = (proto->public_dependency_).current_size_;
      if (iVar2 == (proto->public_dependency_).total_size_) {
        RepeatedField<int>::Reserve(&proto->public_dependency_,iVar2 + 1);
        iVar2 = (proto->public_dependency_).current_size_;
      }
      (proto->public_dependency_).current_size_ = iVar2 + 1;
      ((proto->public_dependency_).rep_)->elements[iVar2] = iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(this + 0x38));
  }
  if (0 < *(int *)(this + 0x48)) {
    lVar8 = 0;
    do {
      iVar1 = *(int *)(*(long *)(this + 0x50) + lVar8 * 4);
      iVar2 = (proto->weak_dependency_).current_size_;
      if (iVar2 == (proto->weak_dependency_).total_size_) {
        RepeatedField<int>::Reserve(&proto->weak_dependency_,iVar2 + 1);
        iVar2 = (proto->weak_dependency_).current_size_;
      }
      (proto->weak_dependency_).current_size_ = iVar2 + 1;
      ((proto->weak_dependency_).rep_)->elements[iVar2] = iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(this + 0x48));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar5 = *(long *)(this + 0x60);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->message_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      Descriptor::CopyTo((Descriptor *)(lVar5 + lVar9),proto_00);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xa8;
    } while (lVar8 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar5 = *(long *)(this + 0x70);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar5 + lVar9),proto_01);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar8 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar5 = *(long *)(this + 0x80);
      proto_02 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(proto->service_).super_RepeatedPtrFieldBase,(Type *)0x0);
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar5 + lVar9),proto_02);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar8 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x88)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar5 = *(long *)(this + 0x98);
      proto_03 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->extension_).super_RepeatedPtrFieldBase,(Type *)0x0);
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar9),proto_03);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xa8;
    } while (lVar8 < *(int *)(this + 0x88));
  }
  pFVar7 = *(FileOptions **)(this + 0xa0);
  pFVar6 = FileOptions::default_instance();
  if (pFVar7 != pFVar6) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    pFVar7 = proto->options_;
    if (pFVar7 == (FileOptions *)0x0) {
      pFVar7 = (FileOptions *)operator_new(0xb0);
      FileOptions::FileOptions(pFVar7);
      proto->options_ = pFVar7;
    }
    FileOptions::CopyFrom(pFVar7,*(FileOptions **)(this + 0xa0));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}